

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_position.c
# Opt level: O3

void test_read_position(void)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  archive *paVar4;
  archive_entry *entry;
  ssize_t sVar5;
  long lVar6;
  size_t write_pos;
  size_t local_38;
  
  lVar6 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'L',L'\x01',"sizeof(nulls) + 512 + 1024 <= sizeof(buff)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'O',(uint)(paVar4 != (archive *)0x0),"NULL != (a = archive_write_new())",
                   (void *)0x0);
  iVar2 = archive_write_set_format_pax_restricted(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'P',(uint)(iVar2 == 0),"0 == archive_write_set_format_pax_restricted(a)",paVar4
                  );
  iVar2 = archive_write_set_bytes_per_block(paVar4,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'Q',(uint)(iVar2 == 0),"0 == archive_write_set_bytes_per_block(a, 512)",paVar4)
  ;
  iVar2 = archive_write_open_memory(paVar4,buff,10000,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'R',(uint)(iVar2 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &write_pos)",paVar4);
  do {
    entry = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'V',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_pathname(entry,"testfile");
    archive_entry_set_mode(entry,0x8000);
    archive_entry_set_size(entry,*(int64_t *)((long)data_sizes + lVar6));
    iVar2 = archive_write_header(paVar4,entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'Z',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",paVar4);
    archive_entry_free(entry);
    lVar1 = *(long *)((long)data_sizes + lVar6);
    sVar5 = archive_write_data(paVar4,nulls,1000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                     ,L']',(uint)(lVar1 == sVar5),
                     "data_sizes[i] == (size_t)archive_write_data(a, nulls, sizeof(nulls))",paVar4);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x28);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'c',(uint)(paVar4 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  wVar3 = archive_read_support_format_tar(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'd',(uint)(wVar3 == L'\0'),"0 == archive_read_support_format_tar(a)",paVar4);
  iVar2 = read_open_memory(paVar4,buff,10000,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'e',(uint)(iVar2 == 0),"0 == read_open_memory(a, buff, sizeof(buff), 512)",
                   paVar4);
  verify_read_positions(paVar4);
  archive_read_free(paVar4);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'j',(uint)(paVar4 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  wVar3 = archive_read_support_format_tar(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'k',(uint)(wVar3 == L'\0'),"0 == archive_read_support_format_tar(a)",paVar4);
  iVar2 = read_open_memory_minimal(paVar4,buff,10000,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'l',(uint)(iVar2 == 0),
                   "0 == read_open_memory_minimal(a, buff, sizeof(buff), 512)",paVar4);
  verify_read_positions(paVar4);
  archive_read_free(paVar4);
  return;
}

Assistant:

DEFINE_TEST(test_read_position)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t write_pos;
	size_t i;

	/* Sanity test */
	assert(sizeof(nulls) + 512 + 1024 <= sizeof(buff));

	/* Create an archive. */
	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_pax_restricted(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &write_pos));

	for (i = 0; i < sizeof(data_sizes)/sizeof(data_sizes[0]); ++i) {
		/* Create a simple archive_entry. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_pathname(ae, "testfile");
		archive_entry_set_mode(ae, S_IFREG);
		archive_entry_set_size(ae, data_sizes[i]);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);
		assertA(data_sizes[i]
		    == (size_t)archive_write_data(a, nulls, sizeof(nulls)));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Read the archive back with a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

	/* Read the archive back without a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory_minimal(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

}